

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.h
# Opt level: O2

int __thiscall
vm_httpreq_cookie::clone
          (vm_httpreq_cookie *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  vm_httpreq_cookie *this_00;
  size_t namelen;
  void *__arg_00;
  undefined4 extraout_var;
  char *__s;
  void *__child_stack_00;
  __fn *__fn_00;
  
  this_00 = (vm_httpreq_cookie *)operator_new(0x18);
  __fn_00 = (__fn *)this->name;
  namelen = strlen((char *)__fn_00);
  __s = this->val;
  if (__s == (char *)0x0) {
    __arg_00 = (void *)0x0;
  }
  else {
    __arg_00 = (void *)strlen(__s);
  }
  vm_httpreq_cookie(this_00,(char *)__fn_00,namelen,__s,(size_t)__arg_00);
  if (this->nxt != (vm_httpreq_cookie *)0x0) {
    iVar1 = clone(this->nxt,__fn_00,__child_stack_00,(int)__s,__arg_00);
    this_00->nxt = (vm_httpreq_cookie *)CONCAT44(extraout_var,iVar1);
  }
  return (int)this_00;
}

Assistant:

vm_httpreq_cookie *clone()
    {
        /* clone myself */
        vm_httpreq_cookie *c = new vm_httpreq_cookie(
            name, strlen(name), val, val != 0 ? strlen(val) : 0);

        /* clone my list tail */
        if (nxt != 0)
            c->nxt = nxt->clone();

        /* return the clone */
        return c;
    }